

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_7::NameApplier::UseNameForParamAndLocalVar(NameApplier *this,Func *func,Var *var)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pbVar3;
  pointer pcVar4;
  Index IVar5;
  Index IVar6;
  Enum EVar7;
  int iVar8;
  string_view name_00;
  size_type *local_50;
  string name;
  
  IVar5 = Func::GetLocalIndex(func,var);
  pTVar1 = (func->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = (func->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  IVar6 = LocalTypes::size(&func->local_types);
  EVar7 = Error;
  if (IVar5 < IVar6 + (int)((ulong)((long)pTVar1 - (long)pTVar2) >> 2)) {
    pbVar3 = (this->param_and_local_index_to_name_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = pbVar3[IVar5]._M_dataplus._M_p;
    local_50 = &name._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,pcVar4 + pbVar3[IVar5]._M_string_length);
    if (var->type_ == Name) {
      if (name._M_dataplus._M_p != (pointer)(var->field_2).name_._M_string_length) {
LAB_00f3d216:
        __assert_fail("name == var->name()",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/apply-names.cc"
                      ,0xd3,
                      "Result wabt::(anonymous namespace)::NameApplier::UseNameForParamAndLocalVar(Func *, Var *)"
                     );
      }
      if (name._M_dataplus._M_p != (pointer)0x0) {
        iVar8 = bcmp(local_50,(var->field_2).name_._M_dataplus._M_p,(size_t)name._M_dataplus._M_p);
        if (iVar8 != 0) goto LAB_00f3d216;
      }
    }
    else if (name._M_dataplus._M_p != (pointer)0x0) {
      name_00.size_ = (size_type)name._M_dataplus._M_p;
      name_00.data_ = (char *)local_50;
      Var::set_name(var,name_00);
    }
    if (local_50 != &name._M_string_length) {
      operator_delete(local_50);
    }
    EVar7 = Ok;
  }
  return (Result)EVar7;
}

Assistant:

Result NameApplier::UseNameForParamAndLocalVar(Func* func, Var* var) {
  Index local_index = func->GetLocalIndex(*var);
  if (local_index >= func->GetNumParamsAndLocals()) {
    return Result::Error;
  }

  std::string name = param_and_local_index_to_name_[local_index];
  if (var->is_name()) {
    assert(name == var->name());
    return Result::Ok;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
  return Result::Ok;
}